

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,void **vtt,int64_t rows,int64_t columns)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  complex<float> *pcVar4;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int64_t in_stack_ffffffffffffff88;
  complex<float> *pcVar5;
  int64_t in_stack_ffffffffffffff90;
  complex<float> *this_00;
  void **in_stack_ffffffffffffff98;
  TPZManVector<int,_5> *in_stack_ffffffffffffffa0;
  
  TPZMatrix<std::complex<float>_>::TPZMatrix
            ((TPZMatrix<std::complex<float>_> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *in_RDI = *in_RSI;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  TPZManVector<int,_5>::TPZManVector(in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98);
  TPZVec<std::complex<float>_>::TPZVec((TPZVec<std::complex<float>_> *)(in_RDI + 0xe));
  if (in_RDX * in_RCX != 0) {
    uVar2 = in_RDX * in_RCX;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pcVar4 = (complex<float> *)operator_new__(uVar3);
    if (uVar2 != 0) {
      pcVar5 = pcVar4 + uVar2;
      this_00 = pcVar4;
      do {
        std::complex<float>::complex(this_00,0.0,0.0);
        this_00 = this_00 + 1;
      } while (this_00 != pcVar5);
    }
    in_RDI[4] = pcVar4;
  }
  return;
}

Assistant:

explicit inline  TPZFMatrix(const int64_t rows ,const int64_t columns = 1) : 
    TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId),
    TPZMatrix<TVar>(rows,columns), fElem(0),fGiven(0),fSize(0) {
        if(rows*columns) fElem = new TVar[rows*columns];
    }